

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int ftp_file_exist(char *filename)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  FILE *__stream;
  int local_1940;
  int tryingtologin;
  int ii;
  int port;
  char turl [1200];
  char ip [100];
  char *saveptr;
  char *tstr;
  char *passive;
  char *newfn;
  char fn [1200];
  char *password;
  char *username;
  char *newhost;
  char host [100];
  char local_eb8 [8];
  char proto [100];
  char local_e48 [8];
  char tmpstr [1200];
  char errorstr [1200];
  char recbuf [1200];
  int tmpint;
  int sock1;
  int status;
  int sock;
  FILE *command;
  FILE *ftpfile;
  char *filename_local;
  
  bVar1 = true;
  sVar3 = strlen(filename);
  if (sVar3 < 0x4aa) {
    strcpy((char *)&ii,"ftp://");
    strcat((char *)&ii,filename);
    iVar2 = NET_ParseUrl((char *)&ii,local_eb8,(char *)&newhost,&tryingtologin,(char *)&newfn);
    if (iVar2 == 0) {
      tryingtologin = 0x15;
      pcVar4 = strrchr((char *)&newhost,0x40);
      if (pcVar4 == (char *)0x0) {
        username = (char *)&newhost;
      }
      else {
        *pcVar4 = '\0';
        username = pcVar4 + 1;
        pcVar4 = strchr((char *)&newhost,0x3a);
        if (pcVar4 != (char *)0x0) {
          pcVar4 = strchr((char *)&newhost,0x3a);
          *pcVar4 = '\0';
        }
      }
      for (local_1940 = 0; local_1940 < 10; local_1940 = local_1940 + 1) {
        sock1 = NET_TcpConnect(username,tryingtologin);
        _status = fdopen(sock1,"r");
        if (_status == (FILE *)0x0) {
          ffpmsg("Failed to convert socket to stdio file (ftp_file_exist)");
          return 0;
        }
        iVar2 = ftp_status((FILE *)_status,"220");
        if (iVar2 == 0) {
          bVar1 = false;
          break;
        }
        ffpmsg("error connecting to remote server, no 220 seen (ftp_file_exist)");
        fclose(_status);
        NET_SendRaw(sock1,"QUIT\r\n",6,0);
        sleep(5);
      }
      if (bVar1) {
        ffpmsg("error connecting to remote server, no 220 seen (ftp_open_network)");
        filename_local._4_4_ = 0;
      }
      else {
        snprintf(local_e48,0x4b0,"USER %s\r\n");
        sVar3 = strlen(local_e48);
        NET_SendRaw(sock1,local_e48,(int)sVar3,0);
        iVar2 = ftp_status((FILE *)_status,"331 ");
        if (iVar2 == 0x226) {
          ffpmsg("Server is requesting SSL, will switch to ftps (ftp_file_exist)");
          fclose(_status);
          NET_SendRaw(sock1,"QUIT\r\n",6,0);
          filename_local._4_4_ = -1;
        }
        else if (iVar2 == 0) {
          snprintf(local_e48,0x4b0,"PASS %s\r\n");
          sVar3 = strlen(local_e48);
          NET_SendRaw(sock1,local_e48,(int)sVar3,0);
          iVar2 = ftp_status((FILE *)_status,"230 ");
          if (iVar2 == 0) {
            pcVar4 = strrchr((char *)&newfn,0x2f);
            if (pcVar4 == (char *)0x0) {
              strcpy(local_e48,"CWD /\r\n");
              passive = (char *)&newfn;
            }
            else {
              *pcVar4 = '\0';
              passive = pcVar4 + 1;
              sVar3 = strlen((char *)&newfn);
              if (sVar3 == 0) {
                strcpy(local_e48,"CWD /\r\n");
              }
              else if ((char)newfn == '/') {
                snprintf(local_e48,0x4b0,"CWD %s\r\n");
              }
              else {
                snprintf(local_e48,0x4b0,"CWD %s\r\n");
              }
            }
            sVar3 = strlen(local_e48);
            NET_SendRaw(sock1,local_e48,(int)sVar3,0);
            iVar2 = ftp_status((FILE *)_status,"250 ");
            if (iVar2 == 0) {
              sVar3 = strlen(passive);
              if (sVar3 == 0) {
                ffpmsg("Null file name (ftp_file_exist)");
                fclose(_status);
                NET_SendRaw(sock1,"QUIT\r\n",6,0);
                filename_local._4_4_ = 0;
              }
              else {
                snprintf(local_e48,0x4b0,"TYPE I\r\n");
                sVar3 = strlen(local_e48);
                NET_SendRaw(sock1,local_e48,(int)sVar3,0);
                iVar2 = ftp_status((FILE *)_status,"200 ");
                if (iVar2 == 0) {
                  NET_SendRaw(sock1,"PASV\r\n",6,0);
                  pcVar4 = fgets(errorstr + 0x4a8,0x4b0,_status);
                  if (pcVar4 == (char *)0x0) {
                    ffpmsg("PASV error (ftp_file_exist)");
                    fclose(_status);
                    NET_SendRaw(sock1,"QUIT\r\n",6,0);
                    filename_local._4_4_ = 0;
                  }
                  else if (((errorstr[0x4a8] == '2') && (errorstr[0x4a9] == '2')) &&
                          (errorstr[0x4aa] == '7')) {
                    pcVar4 = strchr(errorstr + 0x4a8,0x28);
                    if (pcVar4 == (char *)0x0) {
                      ffpmsg("PASV error (ftp_file_exist)");
                      fclose(_status);
                      NET_SendRaw(sock1,"QUIT\r\n",6,0);
                      filename_local._4_4_ = 0;
                    }
                    else {
                      *pcVar4 = '\0';
                      turl[0x4a8] = '\0';
                      pcVar4 = strtok(pcVar4 + 1,",)");
                      if (pcVar4 == (char *)0x0) {
                        ffpmsg("PASV error (ftp_file_exist)");
                        fclose(_status);
                        NET_SendRaw(sock1,"QUIT\r\n",6,0);
                        filename_local._4_4_ = 0;
                      }
                      else {
                        strcpy(turl + 0x4a8,pcVar4);
                        strcat(turl + 0x4a8,".");
                        pcVar4 = strtok((char *)0x0,",)");
                        if (pcVar4 == (char *)0x0) {
                          ffpmsg("PASV error (ftp_file_exist)");
                          fclose(_status);
                          NET_SendRaw(sock1,"QUIT\r\n",6,0);
                          filename_local._4_4_ = 0;
                        }
                        else {
                          strcat(turl + 0x4a8,pcVar4);
                          strcat(turl + 0x4a8,".");
                          pcVar4 = strtok((char *)0x0,",)");
                          if (pcVar4 == (char *)0x0) {
                            ffpmsg("PASV error (ftp_file_exist)");
                            fclose(_status);
                            NET_SendRaw(sock1,"QUIT\r\n",6,0);
                            filename_local._4_4_ = 0;
                          }
                          else {
                            strcat(turl + 0x4a8,pcVar4);
                            strcat(turl + 0x4a8,".");
                            pcVar4 = strtok((char *)0x0,",)");
                            if (pcVar4 == (char *)0x0) {
                              ffpmsg("PASV error (ftp_file_exist)");
                              fclose(_status);
                              NET_SendRaw(sock1,"QUIT\r\n",6,0);
                              filename_local._4_4_ = 0;
                            }
                            else {
                              strcat(turl + 0x4a8,pcVar4);
                              pcVar4 = strtok((char *)0x0,",)");
                              if (pcVar4 == (char *)0x0) {
                                ffpmsg("PASV error (ftp_file_exist)");
                                fclose(_status);
                                NET_SendRaw(sock1,"QUIT\r\n",6,0);
                                filename_local._4_4_ = 0;
                              }
                              else {
                                __isoc99_sscanf(pcVar4,"%d",&tryingtologin);
                                tryingtologin = tryingtologin << 8;
                                pcVar4 = strtok((char *)0x0,",)");
                                if (pcVar4 == (char *)0x0) {
                                  ffpmsg("PASV error (ftp_file_exist)");
                                  fclose(_status);
                                  NET_SendRaw(sock1,"QUIT\r\n",6,0);
                                  filename_local._4_4_ = 0;
                                }
                                else {
                                  __isoc99_sscanf(pcVar4,"%d",recbuf + 0x4a8);
                                  tryingtologin = recbuf._1192_4_ + tryingtologin;
                                  sVar3 = strlen(passive);
                                  if (sVar3 == 0) {
                                    ffpmsg("Null file name (ftp_file_exist)");
                                    fclose(_status);
                                    NET_SendRaw(sock1,"QUIT\r\n",6,0);
                                    filename_local._4_4_ = 0;
                                  }
                                  else {
                                    recbuf._1196_4_ = NET_TcpConnect(turl + 0x4a8,tryingtologin);
                                    __stream = fdopen(recbuf._1196_4_,"r");
                                    if (__stream == (FILE *)0x0) {
                                      ffpmsg("Could not connect to passive port (ftp_file_exist)");
                                      fclose(_status);
                                      NET_SendRaw(sock1,"QUIT\r\n",6,0);
                                      filename_local._4_4_ = 0;
                                    }
                                    else {
                                      snprintf(local_e48,0x4b0,"RETR %s\r\n");
                                      sVar3 = strlen(local_e48);
                                      NET_SendRaw(sock1,local_e48,(int)sVar3,0);
                                      iVar2 = ftp_status((FILE *)_status,"150 ");
                                      if (iVar2 == 0) {
                                        fclose(__stream);
                                        NET_SendRaw(recbuf._1196_4_,"QUIT\r\n",6,0);
                                        fclose(_status);
                                        NET_SendRaw(sock1,"QUIT\r\n",6,0);
                                        filename_local._4_4_ = 1;
                                      }
                                      else {
                                        fclose(__stream);
                                        NET_SendRaw(recbuf._1196_4_,"QUIT\r\n",6,0);
                                        fclose(_status);
                                        NET_SendRaw(sock1,"QUIT\r\n",6,0);
                                        filename_local._4_4_ = 0;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    fclose(_status);
                    NET_SendRaw(sock1,"QUIT\r\n",6,0);
                    filename_local._4_4_ = 0;
                  }
                }
                else {
                  ffpmsg("TYPE I error, 200 not seen (ftp_file_exist)");
                  fclose(_status);
                  NET_SendRaw(sock1,"QUIT\r\n",6,0);
                  filename_local._4_4_ = 0;
                }
              }
            }
            else {
              ffpmsg("CWD error, no 250 seen (ftp_file_exist)");
              fclose(_status);
              NET_SendRaw(sock1,"QUIT\r\n",6,0);
              filename_local._4_4_ = 0;
            }
          }
          else {
            ffpmsg("PASS error, no 230 seen (ftp_file_exist)");
            fclose(_status);
            NET_SendRaw(sock1,"QUIT\r\n",6,0);
            filename_local._4_4_ = 0;
          }
        }
        else {
          ffpmsg("USER error no 331 seen (ftp_file_exist)");
          fclose(_status);
          NET_SendRaw(sock1,"QUIT\r\n",6,0);
          filename_local._4_4_ = 0;
        }
      }
    }
    else {
      snprintf(tmpstr + 0x4a8,0x4b0,"URL Parse Error (ftp_file_exist) %s",filename);
      ffpmsg(tmpstr + 0x4a8);
      filename_local._4_4_ = 0;
    }
  }
  else {
    ffpmsg("ftp filename is too long (ftp_file_exist)");
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

int ftp_file_exist(char *filename)
{
  FILE *ftpfile;
  FILE *command;
  int sock;
  int status;
  int sock1;
  int tmpint;
  char recbuf[MAXLEN];
  char errorstr[MAXLEN];
  char tmpstr[MAXLEN];
  char proto[SHORTLEN];
  char host[SHORTLEN];
  char *newhost;
  char *username;
  char *password;
  char fn[MAXLEN];
  char *newfn;
  char *passive;
  char *tstr;
  char *saveptr;
  char ip[SHORTLEN];
  char turl[MAXLEN];
  int port;
  int ii, tryingtologin = 1;

  /* parse the URL */
  if (strlen(filename) > MAXLEN - 7) {
    ffpmsg("ftp filename is too long (ftp_file_exist)");
    return 0;
  }

  strcpy(turl,"ftp://");
  strcat(turl,filename);
  if (NET_ParseUrl(turl,proto,host,&port,fn)) {
    snprintf(errorstr,MAXLEN,"URL Parse Error (ftp_file_exist) %s",filename);
    ffpmsg(errorstr);
    return 0;
  }

  port = 21;
  /* we might have a user name */
  username = "anonymous";
  password = "user@host.com";
  /* is there an @ sign */
  if (NULL != (newhost = strrchr(host,'@'))) {
    *newhost = '\0'; /* make it a null, */
    newhost++; /* Now newhost points to the host name and host points to the 
		  user name, password combo */
    username = host;
    /* is there a : for a password */
    if (NULL != strchr(username,':')) {
      password = strchr(username,':');
      *password = '\0';
      password++;
    }
  } else {
    newhost = host;
  }

  for (ii = 0; ii < 10; ii++) {  /* make up to 10 attempts to log in */
  
  /* Connect to the host on the required port */
  sock = NET_TcpConnect(newhost,port);
  /* convert it to a stdio file */
  if (NULL == (command = fdopen(sock,"r"))) {
    ffpmsg ("Failed to convert socket to stdio file (ftp_file_exist)");
    return 0;
  }

  /* Wait for the 220 response */
  if (ftp_status(command,"220")) {
    ffpmsg ("error connecting to remote server, no 220 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);

/*    ffpmsg("sleeping for 5 in ftp_file_exist, then try again"); */

    sleep (5);  /* take a nap and hope ftp server sorts itself out in the meantime */

  } else {
    tryingtologin = 0;
    break;
  }
  
  }  

  if (tryingtologin) { /* the 10 attempts were not successful */
     ffpmsg ("error connecting to remote server, no 220 seen (ftp_open_network)");
     return (0);
  }
 
  /* Send the user name and wait for the right response */
  snprintf(tmpstr,MAXLEN,"USER %s\r\n",username);

  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  /* If command is refused due to the connection requiring SSL (ie. an
     fpts connection), this is where it will first be detected by way
     of a 550 error code. */
     
  status = ftp_status(command,"331 ");
  if (status == 550)
  {
    ffpmsg ("Server is requesting SSL, will switch to ftps (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return -1;
  }
  else if (status) {
    ffpmsg ("USER error no 331 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  /* Send the password and wait for the right response */
  snprintf(tmpstr,MAXLEN,"PASS %s\r\n",password);
  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"230 ")) {
    ffpmsg ("PASS error, no 230 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  /* now do the cwd command */
  newfn = strrchr(fn,'/');
  if (newfn == NULL) {
    strcpy(tmpstr,"CWD /\r\n");
    newfn = fn;
  } else {
    *newfn = '\0';
    newfn++;
    if (strlen(fn) == 0) {
      strcpy(tmpstr,"CWD /\r\n");
    } else {
      /* remove the leading slash */
      if (fn[0] == '/') {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",&fn[1]);
      } else {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",fn);
      } 
    }
  }

  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"250 ")) {
    ffpmsg ("CWD error, no 250 seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  if (!strlen(newfn)) {
    ffpmsg("Null file name (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  /* Always use binary mode */
  snprintf(tmpstr,MAXLEN,"TYPE I\r\n");
  status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(command,"200 ")) {
    ffpmsg ("TYPE I error, 200 not seen (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }

  status = NET_SendRaw(sock,"PASV\r\n",6,NET_DEFAULT);

  if (!(fgets(recbuf,MAXLEN,command))) {
    ffpmsg ("PASV error (ftp_file_exist)");
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 0;
  }
  
  /*  Passive mode response looks like
      227 Entering Passive Mode (129,194,67,8,210,80) */
  if (recbuf[0] == '2' && recbuf[1] == '2' && recbuf[2] == '7') {
    /* got a good passive mode response, find the opening ( */
    
    if (!(passive = strchr(recbuf,'('))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    
    *passive = '\0';
    passive++;
    ip[0] = '\0';
      
    /* Messy parsing of response from PASV command */
    
    if (!(tstr = ffstrtok(passive,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcpy(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    strcat(ip,tstr);
    
    /* Done the ip number, now do the port # */
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    sscanf(tstr,"%d",&port);
    port *= 256;
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    sscanf(tstr,"%d",&tmpint);
    port += tmpint;

    if (!strlen(newfn)) {
      ffpmsg("Null file name (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }

    /* Connect to the data port */
    sock1 = NET_TcpConnect(ip,port);
    if (NULL == (ftpfile = fdopen(sock1,"r"))) {
      ffpmsg ("Could not connect to passive port (ftp_file_exist)");
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }

    /* Send the retrieve command */
    snprintf(tmpstr,MAXLEN,"RETR %s\r\n",newfn);
    status = NET_SendRaw(sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

    if (ftp_status(command,"150 ")) {
      fclose(ftpfile); 
      NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
      fclose(command);
      NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
      return 0;
    }
    
    /* if we got here then the file probably exists */

    fclose(ftpfile); 
    NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
    fclose(command); 
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    return 1;
  }
  
  /* no passive mode */

  fclose(command);
  NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  return 0;
}